

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_name.cc
# Opt level: O0

int asn1_string_canon(ASN1_STRING *out,ASN1_STRING *in)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  int local_38;
  int local_34;
  int i;
  int len;
  uchar *from;
  uchar *to;
  ASN1_STRING *in_local;
  ASN1_STRING *out_local;
  
  uVar2 = ASN1_tag2bit(in->type);
  if ((uVar2 & 0x2956) == 0) {
    iVar1 = ASN1_STRING_copy((ASN1_STRING *)out,(ASN1_STRING *)in);
    if (iVar1 == 0) {
      out_local._4_4_ = 0;
    }
    else {
      out_local._4_4_ = 1;
    }
  }
  else {
    out->type = 0xc;
    iVar1 = ASN1_STRING_to_UTF8(&out->data,(ASN1_STRING *)in);
    out->length = iVar1;
    if (out->length == -1) {
      out_local._4_4_ = 0;
    }
    else {
      _i = out->data;
      local_34 = out->length;
      while( true ) {
        bVar3 = false;
        if (0 < local_34) {
          iVar1 = OPENSSL_isspace((uint)*_i);
          bVar3 = iVar1 != 0;
        }
        if (!bVar3) break;
        _i = _i + 1;
        local_34 = local_34 + -1;
      }
      from = _i + local_34;
      while( true ) {
        bVar3 = false;
        if (0 < local_34) {
          iVar1 = OPENSSL_isspace((uint)from[-1]);
          bVar3 = iVar1 != 0;
        }
        if (!bVar3) break;
        from = from + -1;
        local_34 = local_34 + -1;
      }
      from = out->data;
      local_38 = 0;
      while (local_38 < local_34) {
        iVar1 = OPENSSL_isspace((uint)*_i);
        if (iVar1 == 0) {
          iVar1 = OPENSSL_tolower((uint)*_i);
          *from = (uchar)iVar1;
          _i = _i + 1;
          local_38 = local_38 + 1;
        }
        else {
          *from = ' ';
          do {
            _i = _i + 1;
            local_38 = local_38 + 1;
            iVar1 = OPENSSL_isspace((uint)*_i);
          } while (iVar1 != 0);
        }
        from = from + 1;
      }
      out->length = (int)from - (int)out->data;
      out_local._4_4_ = 1;
    }
  }
  return out_local._4_4_;
}

Assistant:

static int asn1_string_canon(ASN1_STRING *out, ASN1_STRING *in) {
  unsigned char *to, *from;
  int len, i;

  // If type not in bitmask just copy string across
  if (!(ASN1_tag2bit(in->type) & ASN1_MASK_CANON)) {
    if (!ASN1_STRING_copy(out, in)) {
      return 0;
    }
    return 1;
  }

  out->type = V_ASN1_UTF8STRING;
  out->length = ASN1_STRING_to_UTF8(&out->data, in);
  if (out->length == -1) {
    return 0;
  }

  to = out->data;
  from = to;

  len = out->length;

  // Convert string in place to canonical form.

  // Ignore leading spaces
  while ((len > 0) && OPENSSL_isspace(*from)) {
    from++;
    len--;
  }

  to = from + len;

  // Ignore trailing spaces
  while ((len > 0) && OPENSSL_isspace(to[-1])) {
    to--;
    len--;
  }

  to = out->data;

  i = 0;
  while (i < len) {
    // Collapse multiple spaces
    if (OPENSSL_isspace(*from)) {
      // Copy one space across
      *to++ = ' ';
      // Ignore subsequent spaces. Note: don't need to check len here
      // because we know the last character is a non-space so we can't
      // overflow.
      do {
        from++;
        i++;
      } while (OPENSSL_isspace(*from));
    } else {
      *to++ = OPENSSL_tolower(*from);
      from++;
      i++;
    }
  }

  out->length = to - out->data;

  return 1;
}